

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O1

void __thiscall cmState::Directory::ComputeRelativePathTopBinary(Directory *this)

{
  undefined8 *puVar1;
  bool bVar2;
  int iVar3;
  PointerType pSVar4;
  PointerType pBVar5;
  Snapshot *pSVar6;
  Snapshot snapshot;
  string result;
  string currentBinary;
  allocator local_d9;
  undefined8 *local_d8;
  iterator iStack_d0;
  Snapshot *local_c8;
  Directory *local_c0;
  Snapshot local_b8;
  string local_98;
  undefined1 local_78 [24];
  cmLinkedTree<cmState::SnapshotDataType> *pcStack_60;
  PositionType local_58;
  string local_50;
  
  local_b8.Position.Position = (this->Snapshot_).Position.Position;
  local_b8.State = (this->Snapshot_).State;
  local_b8.Position.Tree = (this->Snapshot_).Position.Tree;
  local_d8 = (undefined8 *)0x0;
  iStack_d0._M_current = (Snapshot *)0x0;
  local_c8 = (Snapshot *)0x0;
  std::vector<cmState::Snapshot,std::allocator<cmState::Snapshot>>::
  _M_realloc_insert<cmState::Snapshot_const&>
            ((vector<cmState::Snapshot,std::allocator<cmState::Snapshot>> *)&local_d8,(iterator)0x0,
             &local_b8);
  do {
    while( true ) {
      Snapshot::GetBuildsystemDirectoryParent((Snapshot *)local_78,&local_b8);
      local_b8.Position.Position = local_78._16_8_;
      local_b8.State = (cmState *)local_78._0_8_;
      local_b8.Position.Tree = (cmLinkedTree<cmState::SnapshotDataType> *)local_78._8_8_;
      bVar2 = Snapshot::IsValid(&local_b8);
      puVar1 = local_d8;
      if (!bVar2) {
        local_c0 = this;
        pSVar4 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->
                           ((iterator *)(local_d8 + 1));
        local_78._0_8_ = (pSVar4->BuildSystemDirectory).Tree;
        local_78._8_8_ = (pSVar4->BuildSystemDirectory).Position;
        local_58 = puVar1[2];
        local_78._16_8_ = *puVar1;
        pcStack_60 = (cmLinkedTree<cmState::SnapshotDataType> *)puVar1[1];
        pBVar5 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::iterator::operator->
                           ((iterator *)local_78);
        std::__cxx11::string::string
                  ((string *)&local_98,(pBVar5->OutputLocation)._M_dataplus._M_p,
                   (allocator *)&local_50);
        pSVar6 = (Snapshot *)(local_d8 + 3);
        if (pSVar6 != iStack_d0._M_current) {
          do {
            pSVar4 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->
                               (&pSVar6->Position);
            local_78._0_8_ = (pSVar4->BuildSystemDirectory).Tree;
            local_78._8_8_ = (pSVar4->BuildSystemDirectory).Position;
            local_78._16_8_ = pSVar6->State;
            pcStack_60 = (pSVar6->Position).Tree;
            local_58 = (pSVar6->Position).Position;
            pBVar5 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::iterator::operator->
                               ((iterator *)local_78);
            std::__cxx11::string::string
                      ((string *)&local_50,(pBVar5->OutputLocation)._M_dataplus._M_p,&local_d9);
            bVar2 = cmsys::SystemTools::IsSubDirectory(&local_98,&local_50);
            if (bVar2) {
              std::__cxx11::string::_M_assign((string *)&local_98);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            }
            pSVar6 = pSVar6 + 1;
          } while (pSVar6 != iStack_d0._M_current);
        }
        bVar2 = true;
        if (1 < local_98._M_string_length) {
          std::__cxx11::string::substr((ulong)local_78,(ulong)&local_98);
          iVar3 = std::__cxx11::string::compare(local_78);
          bVar2 = iVar3 != 0;
          if ((cmState *)local_78._0_8_ != (cmState *)(local_78 + 0x10)) {
            operator_delete((void *)local_78._0_8_,
                            (ulong)&(((map<cmProperty::ScopeType,_cmPropertyDefinitionMap,_std::less<cmProperty::ScopeType>,_std::allocator<std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>_>_>
                                       *)local_78._16_8_)->_M_t)._M_impl.field_0x1);
          }
        }
        if (bVar2) {
          pBVar5 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::iterator::operator->
                             (&local_c0->DirectoryState);
          std::__cxx11::string::_M_assign((string *)&pBVar5->RelativePathTopBinary);
        }
        else {
          pBVar5 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::iterator::operator->
                             (&local_c0->DirectoryState);
          std::__cxx11::string::_M_replace
                    ((ulong)&pBVar5->RelativePathTopBinary,0,
                     (char *)(pBVar5->RelativePathTopBinary)._M_string_length,0x50ea83);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        if (local_d8 != (undefined8 *)0x0) {
          operator_delete(local_d8,(long)local_c8 - (long)local_d8);
        }
        return;
      }
      if (iStack_d0._M_current != local_c8) break;
      std::vector<cmState::Snapshot,std::allocator<cmState::Snapshot>>::
      _M_realloc_insert<cmState::Snapshot_const&>
                ((vector<cmState::Snapshot,std::allocator<cmState::Snapshot>> *)&local_d8,iStack_d0,
                 &local_b8);
    }
    ((iStack_d0._M_current)->Position).Position = local_b8.Position.Position;
    *(undefined4 *)&(iStack_d0._M_current)->State = local_b8.State._0_4_;
    *(undefined4 *)((long)&(iStack_d0._M_current)->State + 4) = local_b8.State._4_4_;
    *(undefined4 *)&((iStack_d0._M_current)->Position).Tree = local_b8.Position.Tree._0_4_;
    *(undefined4 *)((long)&((iStack_d0._M_current)->Position).Tree + 4) =
         local_b8.Position.Tree._4_4_;
    iStack_d0._M_current = iStack_d0._M_current + 1;
  } while( true );
}

Assistant:

void cmState::Directory::ComputeRelativePathTopBinary()
{
  cmState::Snapshot snapshot = this->Snapshot_;
  std::vector<cmState::Snapshot> snapshots;
  snapshots.push_back(snapshot);
  while (true)
    {
    snapshot = snapshot.GetBuildsystemDirectoryParent();
    if (snapshot.IsValid())
      {
      snapshots.push_back(snapshot);
      }
    else
      {
      break;
      }
    }

  std::string result =
      snapshots.front().GetDirectory().GetCurrentBinary();

  for (std::vector<cmState::Snapshot>::const_iterator it =
       snapshots.begin() + 1; it != snapshots.end(); ++it)
    {
    std::string currentBinary = it->GetDirectory().GetCurrentBinary();
    if(cmSystemTools::IsSubDirectory(result, currentBinary))
      {
      result = currentBinary;
      }
    }

  // The current working directory on Windows cannot be a network
  // path.  Therefore relative paths cannot work when the binary tree
  // is a network path.
  if(result.size() < 2 || result.substr(0, 2) != "//")
    {
    this->DirectoryState->RelativePathTopBinary = result;
    }
  else
    {
    this->DirectoryState->RelativePathTopBinary = "";
    }
}